

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O0

int aura_wait_status_timeout(aura_node *node,int status,timeval *timeout)

{
  _func_void_aura_node_ptr_int_void_ptr *cb_00;
  void *arg_00;
  int iVar1;
  aura_eventloop *loop_00;
  void *arg;
  void *cb;
  aura_eventloop *loop;
  timeval *timeout_local;
  aura_node *paStack_10;
  int status_local;
  aura_node *node_local;
  
  timeout_local._4_4_ = status;
  paStack_10 = node;
  loop_00 = (aura_eventloop *)aura_node_eventloop_get_autocreate(node);
  cb_00 = paStack_10->status_changed_cb;
  arg_00 = paStack_10->status_changed_arg;
  aura_status_changed_cb(paStack_10,wait_status_changed_cb,(void *)((long)&timeout_local + 4));
  if (timeout != (timeval *)0x0) {
    aura_eventloop_loopexit(loop_00,timeout);
  }
  aura_eventloop_dispatch(loop_00,0);
  aura_status_changed_cb(paStack_10,cb_00,arg_00);
  iVar1 = aura_get_status(paStack_10);
  return iVar1;
}

Assistant:

int aura_wait_status_timeout(struct aura_node *node, int status, struct timeval *timeout)
{
	struct aura_eventloop *loop = aura_node_eventloop_get_autocreate(node);
	/* Save current callbacks/args */
	void *cb = node->status_changed_cb;
	void *arg = node->status_changed_arg;
	aura_status_changed_cb(node, wait_status_changed_cb, &status);
	if (timeout)
		aura_eventloop_loopexit(loop, timeout);
	aura_eventloop_dispatch(loop, 0);
	/* restore user callback, if any */
	aura_status_changed_cb(node, cb, arg);
	return aura_get_status(node);
}